

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O2

SingleKdTreeIndex * __thiscall
CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex(NearestNeighborsIndex *this)

{
  SingleKdTreeIndex *this_00;
  
  if (this->_oneof_case_[0] == 0x6e) {
    this_00 = (SingleKdTreeIndex *)(this->IndexType_).linearindex_;
  }
  else {
    clear_IndexType(this);
    this->_oneof_case_[0] = 0x6e;
    this_00 = (SingleKdTreeIndex *)operator_new(0x18);
    SingleKdTreeIndex::SingleKdTreeIndex(this_00);
    (this->IndexType_).singlekdtreeindex_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SingleKdTreeIndex* NearestNeighborsIndex::mutable_singlekdtreeindex() {
  if (!has_singlekdtreeindex()) {
    clear_IndexType();
    set_has_singlekdtreeindex();
    IndexType_.singlekdtreeindex_ = new ::CoreML::Specification::SingleKdTreeIndex;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NearestNeighborsIndex.singleKdTreeIndex)
  return IndexType_.singlekdtreeindex_;
}